

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::FunctionStmtBlock::create_function_handler
          (FunctionStmtBlock *this,uint32_t width,bool is_signed)

{
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  bool local_64 [4];
  undefined1 local_60 [8];
  undefined1 local_58 [28];
  uint32_t local_3c;
  PortType local_38;
  uint32_t width_local;
  bool is_signed_local;
  
  local_3c = width;
  width_local._3_1_ = is_signed;
  if ((this->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffff00000000);
    std::operator+(&local_88,&this->function_name_,"_return");
    local_38 = Clock;
    local_64[0] = false;
    local_64[1] = false;
    local_64[2] = false;
    local_64[3] = false;
    std::
    make_shared<kratos::Port,kratos::Generator*&,kratos::PortDirection,std::__cxx11::string,unsigned_int&,int,kratos::PortType,bool&>
              ((Generator **)local_58,(PortDirection *)&this->parent_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
               (uint *)&local_88,(int *)&local_3c,&local_38,local_64);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&this->function_handler_,
               (__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_88);
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_58._0_8_ = (this->function_name_)._M_dataplus._M_p;
  local_58._8_8_ = (this->function_name_)._M_string_length;
  bVar1 = fmt::v7::to_string_view<char,_0>("{0} already has a function handler");
  format_str.data_ = (char *)bVar1.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar1.data_,format_str,args);
  local_60 = (undefined1  [8])
             (this->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)local_60;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58,__l
             ,(allocator_type *)&local_38);
  VarException::VarException
            (this_00,&local_88,
             (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FunctionStmtBlock::create_function_handler(uint32_t width, bool is_signed) {
    if (function_handler_) {
        throw VarException(::format("{0} already has a function handler", function_name_),
                           {function_handler_.get()});
    }
    function_handler_ =
        std::make_shared<Port>(parent_, PortDirection::In, function_name_ + "_return", width, 1,
                               PortType::Data, is_signed);
}